

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

void __thiscall
cfd::js::api::json::CreateRawPegoutResponse::CreateRawPegoutResponse(CreateRawPegoutResponse *this)

{
  allocator local_25 [20];
  allocator local_11;
  CreateRawPegoutResponse *local_10;
  CreateRawPegoutResponse *this_local;
  
  local_10 = this;
  core::JsonClassBase<cfd::js::api::json::CreateRawPegoutResponse>::JsonClassBase
            (&this->super_JsonClassBase<cfd::js::api::json::CreateRawPegoutResponse>);
  (this->super_JsonClassBase<cfd::js::api::json::CreateRawPegoutResponse>)._vptr_JsonClassBase =
       (_func_int **)&PTR__CreateRawPegoutResponse_01b4ea80;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ignore_items);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->hex_,"",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->btc_address_,"",local_25);
  std::allocator<char>::~allocator((allocator<char> *)local_25);
  CollectFieldName();
  return;
}

Assistant:

CreateRawPegoutResponse() {
    CollectFieldName();
  }